

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

double fcssx(double *b,int pq,void *params)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  void *__dest;
  void *__dest_00;
  int iVar9;
  long lVar10;
  void *pvVar11;
  double *pdVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  double *pdVar18;
  long lVar19;
  uint uVar20;
  double dVar21;
  double dVar22;
  
  uVar17 = *params;
  lVar19 = (long)(int)uVar17;
  iVar9 = *(int *)((long)params + 0xc);
  lVar10 = (long)iVar9;
  uVar1 = *(uint *)((long)params + 8);
  uVar14 = *(uint *)((long)params + 0x10);
  iVar7 = uVar14 * iVar9;
  uVar8 = iVar7 + uVar17;
  uVar2 = *(uint *)((long)params + 0x18);
  uVar20 = uVar2 * iVar9 + uVar1;
  uVar3 = *(uint *)((long)params + 0x28);
  uVar4 = *(uint *)((long)params + 0x2c);
  iVar5 = *(int *)((long)params + 0x58);
  __dest = malloc((long)(int)uVar8 << 3);
  __dest_00 = malloc((long)(int)uVar20 << 3);
  if (0 < lVar19) {
    memcpy(__dest,b,(ulong)uVar17 * 8);
  }
  if (0 < iVar7) {
    uVar6 = uVar17 + 1;
    if ((int)(uVar17 + 1) < (int)uVar8) {
      uVar6 = uVar8;
    }
    memset((void *)((long)__dest + lVar19 * 8),0,(ulong)(~uVar17 + uVar6) * 8 + 8);
  }
  if (0 < (int)uVar1) {
    memcpy(__dest_00,b + lVar19,(ulong)uVar1 * 8);
  }
  if (0 < (int)(uVar2 * iVar9)) {
    uVar6 = uVar1 + 1;
    if ((int)(uVar1 + 1) < (int)uVar20) {
      uVar6 = uVar20;
    }
    memset((void *)((long)__dest_00 + (long)(int)uVar1 * 8),0,(ulong)(~uVar1 + uVar6) * 8 + 8);
  }
  if (0 < (int)uVar14) {
    pvVar11 = (void *)((long)__dest + lVar10 * 8);
    uVar13 = 0;
    do {
      dVar21 = b[(long)(int)(uVar1 + uVar17) + uVar13];
      uVar13 = uVar13 + 1;
      *(double *)((long)__dest + uVar13 * lVar10 * 8 + -8) =
           *(double *)((long)__dest + uVar13 * lVar10 * 8 + -8) + dVar21;
      if (0 < (int)uVar17) {
        uVar15 = 0;
        do {
          *(double *)((long)pvVar11 + uVar15 * 8) =
               *(double *)((long)pvVar11 + uVar15 * 8) - b[uVar15] * dVar21;
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      pvVar11 = (void *)((long)pvVar11 + lVar10 * 8);
    } while (uVar13 != uVar14);
  }
  iVar9 = uVar1 + uVar17 + uVar14;
  if (0 < (int)uVar2) {
    pvVar11 = (void *)((long)__dest_00 + lVar10 * 8);
    uVar13 = 0;
    do {
      dVar21 = b[(long)iVar9 + uVar13];
      uVar13 = uVar13 + 1;
      *(double *)((long)__dest_00 + uVar13 * lVar10 * 8 + -8) =
           *(double *)((long)__dest_00 + uVar13 * lVar10 * 8 + -8) + dVar21;
      if (0 < (int)uVar1) {
        uVar15 = 0;
        do {
          *(double *)((long)pvVar11 + uVar15 * 8) =
               b[lVar19 + uVar15] * dVar21 + *(double *)((long)pvVar11 + uVar15 * 8);
          uVar15 = uVar15 + 1;
        } while (uVar1 != uVar15);
      }
      pvVar11 = (void *)((long)pvVar11 + lVar10 * 8);
    } while (uVar13 != uVar2);
  }
  if (0 < (int)uVar8) {
    uVar13 = 0;
    do {
      *(undefined8 *)((long)params + uVar13 * 8 + (long)(int)(iVar5 + uVar3) * 8 + 0x60) = 0;
      uVar13 = uVar13 + 1;
    } while (uVar8 != uVar13);
  }
  if (0 < (int)uVar3 && 0 < (int)uVar4) {
    pdVar12 = (double *)((long)params + (long)(int)(uVar3 * 3 + iVar5) * 8 + 0x60);
    uVar13 = 0;
    do {
      dVar21 = *(double *)((long)params + (uVar13 + (long)(int)(iVar5 + uVar3 * 2)) * 8 + 0x60);
      uVar15 = 0;
      pdVar18 = pdVar12;
      do {
        dVar21 = dVar21 - *pdVar18 * b[(long)(int)(iVar9 + uVar2) + uVar15];
        uVar15 = uVar15 + 1;
        pdVar18 = pdVar18 + uVar3;
      } while (uVar4 != uVar15);
      *(double *)((long)params + ((long)iVar5 + uVar13) * 8 + 0x60) = dVar21;
      uVar13 = uVar13 + 1;
      pdVar12 = pdVar12 + 1;
    } while (uVar13 != uVar3);
  }
  if ((int)uVar8 < (int)uVar3) {
    lVar19 = iVar7 + lVar19;
    lVar10 = ((ulong)(uVar17 + iVar5 + iVar7) << 0x20) + -0x100000000;
    iVar9 = iVar7 + uVar17 + uVar3 + iVar5 + -1;
    uVar17 = 0;
    dVar21 = 0.0;
    do {
      uVar1 = uVar20;
      if ((int)uVar17 < (int)uVar20) {
        uVar1 = uVar17;
      }
      dVar22 = *(double *)((long)params + (lVar19 + iVar5) * 8 + 0x60);
      if (0 < (int)uVar8) {
        uVar13 = 0;
        lVar16 = lVar10;
        do {
          dVar22 = dVar22 - *(double *)((long)__dest + uVar13 * 8) *
                            *(double *)((long)params + (lVar16 >> 0x1d) + 0x60);
          uVar13 = uVar13 + 1;
          lVar16 = lVar16 + -0x100000000;
        } while (uVar8 != uVar13);
      }
      uVar14 = (int)lVar19 - uVar8;
      if ((int)uVar20 <= (int)uVar14) {
        uVar14 = uVar20;
      }
      if (0 < (int)uVar14) {
        uVar13 = 0;
        iVar7 = iVar9;
        do {
          dVar22 = dVar22 - *(double *)((long)__dest_00 + uVar13 * 8) *
                            *(double *)((long)params + (long)iVar7 * 8 + 0x60);
          uVar13 = uVar13 + 1;
          iVar7 = iVar7 + -1;
        } while (uVar1 != uVar13);
      }
      uVar17 = uVar17 + 1;
      *(double *)((long)params + (lVar19 + (int)(iVar5 + uVar3)) * 8 + 0x60) = dVar22;
      dVar21 = dVar21 + dVar22 * dVar22;
      lVar19 = lVar19 + 1;
      lVar10 = lVar10 + 0x100000000;
      iVar9 = iVar9 + 1;
    } while (lVar19 < (int)uVar3);
  }
  else {
    dVar21 = 0.0;
    uVar17 = 0;
  }
  *(double *)((long)params + 0x48) = dVar21;
  *(uint *)((long)params + 0x30) = uVar17;
  dVar21 = log(dVar21 / (double)(int)uVar17);
  *(double *)((long)params + 0x50) = dVar21 * 0.5;
  free(__dest);
  free(__dest_00);
  return dVar21 * 0.5;
}

Assistant:

double fcssx(double *b, int pq, void *params) {
	double value, ssq,temp;
	int p, q, ps, qs, s, d, D, offset,jm;
	int ip, iq, i, j, N,iter,ncond,M,naram;
	double *phi, *theta,*reg;

	value = ssq =  0.0;
	
	xlik_css_object obj = (xlik_css_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);

	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	s = obj->s;
	M = obj->M;
	d = obj->d;
	D = obj->D;

	offset = obj->offset;
	ncond = p + s* ps;
	naram = p + q + ps + qs;

	//ncond = ncond + ncond1;

	reg = &obj->x[offset+3*N];

	//printf("\n %d %d %d \n", s,ps, qs);

	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);



	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	//mdisplay(theta, 1, q + s*qs);
	//mdisplay(b, 1, p + q + ps + qs);
	for (i = 0; i < ncond; ++i) {
		obj->x[offset+N + i] = 0.0;
	}


	if (obj->M > 0) {
		for (i = 0; i < N; ++i) {
			temp = obj->x[offset + 2 * N + i];
			for(j = 0; j < M;++j) {
				temp -= reg[j*N+i]*b[naram+j];
			}
			obj->x[offset + i] = temp;
		}
	}
	iter = 0;
	ssq = 0.0;
	for (i = ncond; i < N; ++i) {
		iter++;
		temp = obj->x[offset+i];

		for (j = 0; j < ip; ++j) {
			temp = temp - phi[j] * obj->x[offset + i - j - 1];
		}

		if (i - ncond < iq) {
			jm = i - ncond;
		}
		else {
			jm = iq;
		}

		for (j = 0; j < jm; ++j) {
			temp = temp - theta[j] * obj->x[offset+N + i - j - 1];
		}

		obj->x[offset+N + i] = temp;
		ssq += temp * temp;
	}
	obj->ssq = ssq;
	obj->Nmncond = iter;
	value = 0.5 * log(ssq / (double)iter);
	obj->loglik = value;

	free(phi);
	free(theta);
	return value;
}